

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O1

void __thiscall ncnn::DeformableConv2D_x86_avx::destroy_pipeline(DeformableConv2D_x86_avx *this)

{
  Option *in_RSI;
  
  destroy_pipeline((DeformableConv2D_x86_avx *)
                   ((long)&this->_vptr_DeformableConv2D_x86_avx +
                   (long)this->_vptr_DeformableConv2D_x86_avx[-7]),in_RSI);
  return;
}

Assistant:

int DeformableConv2D_x86_avx::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}